

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_vbuf::load_ogf3(xr_vbuf *this,xr_reader *r,size_t n,ogf_vertex_format vf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint16_t bone0_00;
  uint16_t bone1_00;
  uint32_t bone0_01;
  ulong uVar9;
  finfluence *pfVar10;
  fvector3 *pfVar11;
  fvector2 *pfVar12;
  float weight0;
  _influence<unsigned_int,_float> *local_b0;
  _influence<unsigned_int,_float> *local_78;
  uint16_t bone1;
  size_t sStack_48;
  uint16_t bone0;
  size_t i_1;
  size_t i;
  ogf_vertex_format vf_local;
  size_t n_local;
  xr_reader *r_local;
  xr_vbuf *this_local;
  
  if (vf == OGF3_VERTEXFORMAT_FVF_1L) {
    clear(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = n;
    uVar9 = SUB168(auVar1 * ZEXT816(0x24),0);
    if (SUB168(auVar1 * ZEXT816(0x24),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (finfluence *)operator_new__(uVar9);
    if (n != 0) {
      local_78 = pfVar10;
      do {
        _influence<unsigned_int,_float>::_influence(local_78);
        local_78 = local_78 + 1;
      } while (local_78 != pfVar10 + n);
    }
    this->m_influences = pfVar10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = n;
    uVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar11 = (fvector3 *)operator_new__(uVar9);
    this->m_points = pfVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = n;
    uVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar11 = (fvector3 *)operator_new__(uVar9);
    this->m_normals = pfVar11;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = n;
    uVar9 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar12 = (fvector2 *)operator_new__(uVar9);
    this->m_texcoords = pfVar12;
    xr_flexbuf::set_size(&this->super_xr_flexbuf,n);
    for (i_1 = 0; i_1 != n; i_1 = i_1 + 1) {
      xr_reader::r_fvector3(r,this->m_points + i_1);
      xr_reader::r_fvector3(r,this->m_normals + i_1);
      xr_reader::r_fvector2(r,this->m_texcoords + i_1);
      pfVar10 = this->m_influences;
      bone0_01 = xr_reader::r_u32(r);
      _influence<unsigned_int,_float>::set(pfVar10 + i_1,bone0_01);
    }
    make_signature(this);
  }
  else if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
    clear(this);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = n;
    uVar9 = SUB168(auVar5 * ZEXT816(0x24),0);
    if (SUB168(auVar5 * ZEXT816(0x24),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (finfluence *)operator_new__(uVar9);
    if (n != 0) {
      local_b0 = pfVar10;
      do {
        _influence<unsigned_int,_float>::_influence(local_b0);
        local_b0 = local_b0 + 1;
      } while (local_b0 != pfVar10 + n);
    }
    this->m_influences = pfVar10;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = n;
    uVar9 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar11 = (fvector3 *)operator_new__(uVar9);
    this->m_points = pfVar11;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = n;
    uVar9 = SUB168(auVar7 * ZEXT816(0xc),0);
    if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar11 = (fvector3 *)operator_new__(uVar9);
    this->m_normals = pfVar11;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = n;
    uVar9 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar12 = (fvector2 *)operator_new__(uVar9);
    this->m_texcoords = pfVar12;
    xr_flexbuf::set_size(&this->super_xr_flexbuf,n);
    for (sStack_48 = 0; sStack_48 != n; sStack_48 = sStack_48 + 1) {
      bone0_00 = xr_reader::r_u16(r);
      bone1_00 = xr_reader::r_u16(r);
      xr_reader::r_fvector3(r,this->m_points + sStack_48);
      xr_reader::r_fvector3(r,this->m_normals + sStack_48);
      xr_reader::advance(r,0x18);
      pfVar10 = this->m_influences;
      weight0 = xr_reader::r_float(r);
      _influence<unsigned_int,_float>::set_wo_reorder(pfVar10 + sStack_48,bone0_00,bone1_00,weight0)
      ;
      xr_reader::r_fvector2(r,this->m_texcoords + sStack_48);
    }
    make_signature(this);
  }
  else {
    load_d3d7(this,r,n,vf);
  }
  return;
}

Assistant:

void xr_vbuf::load_ogf3(xr_reader& r, size_t n, ogf_vertex_format vf)
{
	if (vf == OGF3_VERTEXFORMAT_FVF_1L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.r_fvector2(m_texcoords[i]);
			m_influences[i].set(r.r_u32());
		}
		make_signature();
	} else if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			uint16_t bone0 = r.r_u16();
			uint16_t bone1 = r.r_u16();
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.advance(2*sizeof(fvector3));	// skip tangent and binormal
			m_influences[i].set_wo_reorder(bone0, bone1, r.r_float());//set_wo_reorder ����� ��� �������������� ������
			r.r_fvector2(m_texcoords[i]);
		}
		make_signature();
	} else {
		load_d3d7(r, n, vf);
	}
}